

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O2

Resource * __thiscall tcu::DirArchive::getResource(DirArchive *this,char *name)

{
  FileResource *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (FileResource *)operator_new(0x30);
  std::operator+(&local_38,&this->m_path,name);
  FileResource::FileResource(this_00,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  return &this_00->super_Resource;
}

Assistant:

Resource* DirArchive::getResource (const char* name) const
{
	return static_cast<Resource*>(new FileResource((m_path + name).c_str()));
}